

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void DBaseDecal::SerializeChain(FArchive *arc,DBaseDecal **first)

{
  DWORD DVar1;
  DBaseDecal *in_RAX;
  DBaseDecal **ppDVar2;
  int iVar3;
  bool bVar4;
  DBaseDecal *local_28;
  
  if (arc->m_Loading == false) {
    iVar3 = 0;
    for (ppDVar2 = first; *ppDVar2 != (DBaseDecal *)0x0; ppDVar2 = &(*ppDVar2)->WallNext) {
      iVar3 = iVar3 + -1;
    }
    FArchive::WriteCount(arc,-iVar3);
    for (; local_28 = *first, iVar3 != 0; iVar3 = iVar3 + 1) {
      ::operator<<(arc,&local_28);
      first = &local_28->WallNext;
    }
  }
  else {
    local_28 = in_RAX;
    DVar1 = FArchive::ReadCount(arc);
    while (bVar4 = DVar1 != 0, DVar1 = DVar1 - 1, bVar4) {
      ::operator<<(arc,&local_28);
      *first = local_28;
      local_28->WallPrev = first;
      first = &local_28->WallNext;
    }
  }
  return;
}

Assistant:

void DBaseDecal::SerializeChain (FArchive &arc, DBaseDecal **first)
{
	DWORD numInChain;
	DBaseDecal *fresh;
	DBaseDecal **firstptr = first;

	if (arc.IsLoading ())
	{
		numInChain = arc.ReadCount ();
		
		while (numInChain--)
		{
			arc << fresh;
			*firstptr = fresh;
			fresh->WallPrev = firstptr;
			firstptr = &fresh->WallNext;
		}
	}
	else
	{
		numInChain = 0;
		fresh = *firstptr;
		while (fresh != NULL)
		{
			fresh = fresh->WallNext;
			++numInChain;
		}
		arc.WriteCount (numInChain);
		fresh = *firstptr;
		while (numInChain--)
		{
			arc << fresh;
			fresh = fresh->WallNext;
		}
	}
}